

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

void __thiscall LEARNER::learner<char,_char>::finish(learner<char,_char> *this)

{
  learner<char,_char> *in_RDI;
  
  if (*(long *)(in_RDI + 0xb8) != 0) {
    (**(code **)(in_RDI + 200))(*(undefined8 *)(in_RDI + 0xb8));
    free(*(void **)(in_RDI + 0xb8));
  }
  if (*(long *)(in_RDI + 0xc0) != 0) {
    finish(in_RDI);
    free(*(void **)(in_RDI + 0xc0));
  }
  return;
}

Assistant:

inline void finish()
  {
    if (finisher_fd.data)
    {
      finisher_fd.func(finisher_fd.data);
      free(finisher_fd.data);
    }
    if (finisher_fd.base)
    {
      finisher_fd.base->finish();
      free(finisher_fd.base);
    }
  }